

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_content<httplib::Response>(Stream *strm,Response *x,Progress *progress)

{
  Headers *this;
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  const_iterator cVar6;
  _Rb_tree_header *p_Var7;
  char *pcVar8;
  pointer pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  key_type local_80;
  Progress *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  pointer local_38;
  
  this = &x->headers;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Content-Length","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this->_M_t,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  p_Var7 = &(x->headers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node == p_Var7) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Transfer-Encoding","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this->_M_t,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar6._M_node == p_Var7) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)(cVar6._M_node + 2);
    }
    iVar3 = strcasecmp(pcVar8,"chunked");
    if (iVar3 == 0) {
      bVar1 = read_content_chunked(strm,&x->body);
    }
    else {
      do {
        iVar3 = (*strm->_vptr_Stream[2])(strm,&local_80,1);
        if (iVar3 < 0) {
          p_Var7 = (_Rb_tree_header *)0x0;
LAB_0014d9bd:
          bVar2 = false;
        }
        else {
          if (iVar3 == 0) {
            p_Var7 = (_Rb_tree_header *)0x1;
            goto LAB_0014d9bd;
          }
          std::__cxx11::string::push_back((char)&x->body);
          bVar2 = true;
        }
        bVar1 = (byte)p_Var7;
      } while (bVar2);
    }
  }
  else {
    iVar3 = get_header_value_int(this,"Content-Length",0);
    if (iVar3 == 0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_60 = progress;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Transfer-Encoding","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this->_M_t,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      progress = local_60;
      if ((_Rb_tree_header *)cVar6._M_node == p_Var7) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)(cVar6._M_node + 2);
      }
      iVar4 = strcasecmp(pcVar8,"chunked");
      if (iVar4 == 0) {
        bVar2 = read_content_chunked(strm,&x->body);
        p_Var7 = (_Rb_tree_header *)(ulong)bVar2;
      }
      bVar1 = (byte)p_Var7;
      if (iVar4 == 0) goto LAB_0014daaa;
    }
    pcVar9 = (pointer)(long)iVar3;
    std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)&local_58,progress);
    std::__cxx11::string::_M_replace_aux((ulong)&x->body,0,(x->body)._M_string_length,(char)iVar3);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    do {
      bVar1 = pcVar9 <= paVar10;
      if (pcVar9 <= paVar10) break;
      uVar5 = (*strm->_vptr_Stream[2])
                        (strm,paVar10->_M_local_buf + (long)(x->body)._M_dataplus._M_p);
      if (((int)uVar5 < 1) ||
         ((paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar10->_M_local_buf + uVar5), local_48 != (code *)0x0 &&
          (local_80._M_dataplus._M_p = (pointer)paVar10, local_38 = pcVar9,
          bVar2 = (*local_40)(&local_58,(unsigned_long *)&local_80,(unsigned_long *)&local_38),
          !bVar2)))) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
      }
    } while (bVar2);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
LAB_0014daaa:
  return (bool)(bVar1 & 1);
}

Assistant:

bool read_content(Stream& strm, T& x, Progress progress = Progress())
{
    if (has_header(x.headers, "Content-Length")) {
        auto len = get_header_value_int(x.headers, "Content-Length", 0);
        if (len == 0) {
            const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", 0, "");
            if (!strcasecmp(encoding, "chunked")) {
                return read_content_chunked(strm, x.body);
            }
        }
        return read_content_with_length(strm, x.body, len, progress);
    } else {
        const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", 0, "");
        if (!strcasecmp(encoding, "chunked")) {
            return read_content_chunked(strm, x.body);
        }
        return read_content_without_length(strm, x.body);
    }
    return true;
}